

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_test.cpp
# Opt level: O0

void __thiscall bidfx_public_api::price::SubscriptionTest::SubscriptionTest(SubscriptionTest *this)

{
  BasicUserInfo *pBVar1;
  string *psVar2;
  Tenor *pTVar3;
  undefined8 *puVar4;
  Subscription *pSVar5;
  Subject local_250 [31];
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  SubjectFactory local_198 [8];
  FX local_190 [64];
  undefined8 local_150;
  string local_148 [32];
  Subject local_128 [30];
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [39];
  allocator<char> local_41;
  string local_40 [48];
  SubscriptionTest *local_10;
  SubscriptionTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__SubscriptionTest_003de110;
  bidfx_public_api::price::subject::Subject::Subject(&this->subject_);
  pBVar1 = (BasicUserInfo *)operator_new(0xf0);
  local_10a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"localhost",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"lasman",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"FX_ACCT",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"CPP",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"0",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"-",&local_109);
  bidfx_public_api::BasicUserInfo::BasicUserInfo
            (pBVar1,local_40,local_68,local_90,local_b8,local_e0,local_108);
  local_10a = 0;
  this->user_info = (UserInfo *)pBVar1;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  bidfx_public_api::price::subject::SubjectFactory::SubjectFactory(local_198,this->user_info);
  bidfx_public_api::price::subject::SubjectFactory::Fx();
  local_150 = bidfx_public_api::price::subject::SubjectFactory::FX::Stream();
  bidfx_public_api::price::subject::SubjectFactory::FX::FXDealable::Forward();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"FX_ACCT",&local_1b9);
  psVar2 = (string *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::BuySideAccount(local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"EUR",&local_1e1);
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Currency(psVar2)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_208,"EURUSD",&local_209);
  bidfx_public_api::price::subject::SubjectFactory::FX::Forward::CurrencyPair(psVar2);
  pTVar3 = (Tenor *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Quantity(1000.0);
  psVar2 = (string *)bidfx_public_api::price::subject::SubjectFactory::FX::Forward::Tenor(pTVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_230,"DBFX",&local_231);
  puVar4 = (undefined8 *)
           bidfx_public_api::price::subject::SubjectFactory::FX::Forward::LiquidityProvider(psVar2);
  (**(code **)*puVar4)(local_128);
  bidfx_public_api::price::subject::Subject::operator=(&this->subject_,local_128);
  subject::Subject::~Subject(local_128);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  subject::SubjectFactory::FX::~FX(local_190);
  pSVar5 = (Subscription *)operator_new(0x50);
  bidfx_public_api::price::subject::Subject::Subject(local_250,&this->subject_);
  bidfx_public_api::price::Subscription::Subscription(pSVar5,local_250);
  this->subscription_ = pSVar5;
  subject::Subject::~Subject(local_250);
  return;
}

Assistant:

SubscriptionTest()
    {
        user_info = new BasicUserInfo("localhost", "lasman", "FX_ACCT", "CPP", "0", "-");
        subject_ = subject::SubjectFactory(user_info).Fx().Stream().Forward().BuySideAccount("FX_ACCT").Currency("EUR").CurrencyPair("EURUSD").Quantity(1000).Tenor(Tenor::IN_2_MONTHS).LiquidityProvider("DBFX").CreateSubject();
        subscription_ = new Subscription(subject_);
    }